

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_symbol(char *value)

{
  size_t sVar1;
  LOGGER_LOG p_Var2;
  AMQP_VALUE_DATA *pAVar3;
  void *__dest;
  int iVar4;
  char *pcVar5;
  
  if (value == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar5 = "NULL argument";
      iVar4 = 0x483;
LAB_00104e44:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_create_symbol",iVar4,1,pcVar5);
      return (AMQP_VALUE)0x0;
    }
  }
  else {
    sVar1 = strlen(value);
    if (sVar1 < 0xffffffff) {
      pAVar3 = REFCOUNT_AMQP_VALUE_DATA_Create();
      if (pAVar3 == (AMQP_VALUE_DATA *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar5 = "Cannot allocate memory for AMQP value";
          iVar4 = 0x495;
          goto LAB_00104e44;
        }
      }
      else {
        pAVar3->type = AMQP_TYPE_SYMBOL;
        __dest = malloc(sVar1 + 1);
        (pAVar3->value).binary_value.bytes = __dest;
        if (__dest != (void *)0x0) {
          memcpy(__dest,value,sVar1 + 1);
          return pAVar3;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_create_symbol",0x49f,1,"Cannot allocate memory for symbol string");
        }
        free((void *)((long)&pAVar3[-1].value + 8));
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar5 = "string too long to be represented as a symbol";
        iVar4 = 0x48c;
        goto LAB_00104e44;
      }
    }
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_symbol(const char* value)
{
    AMQP_VALUE result;
    if (value == NULL)
    {
        /* Codes_SRS_AMQPVALUE_01_400: [If value is NULL, amqpvalue_create_symbol shall fail and return NULL.] */
        LogError("NULL argument");
        result = NULL;
    }
    else
    {
        size_t length = strlen(value);
        if (length >= UINT32_MAX)
        {
            /* Codes_SRS_AMQPVALUE_01_401: [ If the string pointed to by value is longer than 2^32-1 then amqpvalue_create_symbol shall return NULL. ]*/
            LogError("string too long to be represented as a symbol");
            result = NULL;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_143: [If allocating the AMQP_VALUE fails then amqpvalue_create_symbol shall return NULL.] */
            result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
            if (result == NULL)
            {
                LogError("Cannot allocate memory for AMQP value");
                result = NULL;
            }
            else
            {
                /* Codes_SRS_AMQPVALUE_01_142: [amqpvalue_create_symbol shall return a handle to an AMQP_VALUE that stores a symbol (ASCII string) value.] */
                result->type = AMQP_TYPE_SYMBOL;
                result->value.symbol_value.chars = (char*)malloc(length + 1);
                if (result->value.symbol_value.chars == NULL)
                {
                    LogError("Cannot allocate memory for symbol string");
                    REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
                    result = NULL;
                }
                else
                {
                    (void)memcpy(result->value.symbol_value.chars, value, length + 1);
                }
            }
        }
    }

    return result;
}